

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUCachePolicyULT.cpp
# Opt level: O3

void __thiscall CTestXe_HP_CachePolicy::CheckPAT(CTestXe_HP_CachePolicy *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  uint uVar2;
  char *message;
  ulong uVar3;
  undefined1 local_80 [8];
  GMM_CACHE_POLICY_ELEMENT ClientRequest;
  unsigned_long PATIndex;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  uVar3 = 0;
  this_00 = &gtest_ar.message_;
  do {
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
              (local_80,CommonULT::pGmmULTClientContext,uVar3 & 0xffffffff);
    if ((ClientRequest.IDCode._3_1_ & 0x20) != 0) {
      uVar2 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x160))
                        (CommonULT::pGmmULTClientContext,0,uVar3 & 0xffffffff,0,0);
      ClientRequest._32_8_ = ZEXT48(uVar2);
      gtest_ar.message_.ptr_._0_4_ = 0xffffffff;
      testing::internal::CmpHelperNE<unsigned_long,unsigned_int>
                (local_48,"PATIndex","((uint32_t)-1)",(unsigned_long *)&ClientRequest.Override,
                 (uint *)this_00);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) + 0x10),
                   "Usage# ",7);
        std::ostream::_M_insert<unsigned_long>
                  (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) + 0x10),
                   ": No matching PAT Index",0x17);
        message = "";
        if (gtest_ar._0_8_ != 0) {
          message = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&PATIndex,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUCachePolicyULT.cpp"
                   ,0xed,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&PATIndex,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&PATIndex);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x11e);
  return;
}

Assistant:

void CTestXe_HP_CachePolicy::CheckPAT()
{
    // Check Usage PAT index against PAT settings
    for(unsigned long Usage = GMM_RESOURCE_USAGE_UNKNOWN; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        GMM_CACHE_POLICY_ELEMENT ClientRequest = pGmmULTClientContext->GetCachePolicyElement((GMM_RESOURCE_USAGE_TYPE)Usage);
        if(ClientRequest.Initialized == false) // undefined resource in platform
        {
            continue;
        }
        unsigned long PATIndex = pGmmULTClientContext->CachePolicyGetPATIndex(NULL, (GMM_RESOURCE_USAGE_TYPE)Usage, NULL, false); 
        //printf("Xe HPG: Usage: %d --> PAT Index: [%d]\n", Usage, PATIndex);
        EXPECT_NE(PATIndex, GMM_PAT_ERROR) << "Usage# " << Usage << ": No matching PAT Index";
    }
}